

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O1

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_t fn,void *udata)

{
  Members *pMVar1;
  void *pvVar2;
  undefined8 uVar3;
  function<void_(const_unsigned_char_*,_unsigned_long)> *this_00;
  undefined8 *puVar4;
  pointer *__ptr;
  _Any_data __tmp;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ef540;
  this_00 = (function<void_(const_unsigned_char_*,_unsigned_long)> *)operator_new(0x20);
  local_58 = (code *)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function
            (this_00,(function<void_(const_unsigned_char_*,_unsigned_long)> *)&local_68);
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>.
  super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl = (Members *)this_00;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
           .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl;
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = identifier;
  puVar4[1] = fn;
  puVar4[2] = udata;
  local_68._0_4_ = SUB84(puVar4,0);
  local_68._4_4_ = (undefined4)((ulong)puVar4 >> 0x20);
  local_48 = local_68._0_4_;
  uStack_44 = local_68._4_4_;
  uStack_40 = local_68._8_4_;
  uStack_3c = local_68._12_4_;
  pvVar2 = *(void **)&(pMVar1->fn).super__Function_base;
  uVar3 = *(undefined8 *)((long)&(pMVar1->fn).super__Function_base + 8);
  *(undefined4 *)&(pMVar1->fn).super__Function_base = local_68._0_4_;
  *(undefined4 *)((long)&(pMVar1->fn).super__Function_base + 4) = local_68._4_4_;
  *(undefined4 *)((long)&(pMVar1->fn).super__Function_base + 8) = local_68._8_4_;
  *(undefined4 *)((long)&(pMVar1->fn).super__Function_base + 0xc) = local_68._12_4_;
  local_58 = *(_Manager_type *)((long)&(pMVar1->fn).super__Function_base + 0x10);
  *(code **)((long)&(pMVar1->fn).super__Function_base + 0x10) =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_manager;
  p_Stack_50 = (pMVar1->fn)._M_invoker;
  (pMVar1->fn)._M_invoker =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_invoke;
  if (local_58 != (_Manager_type)0x0) {
    local_68._M_unused._M_object = pvVar2;
    local_68._8_8_ = uVar3;
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_t fn, void* udata) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(data, len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}